

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdown.cpp
# Opt level: O0

ssize_t __thiscall markdown::Document::read(Document *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  element_type *peVar2;
  ulong uVar3;
  BlankLine *this_00;
  RawText *this_01;
  undefined4 in_register_00000034;
  Container *local_a8;
  shared_ptr<markdown::Token> local_90;
  shared_ptr<markdown::Token> local_80 [2];
  undefined1 local_60 [8];
  TokenGroup tgt;
  string line;
  Container *tokens;
  istream *in_local;
  Document *this_local;
  
  if ((this->mProcessed & 1U) == 0) {
    peVar2 = boost::shared_ptr<markdown::Token>::get(&this->mTokenContainer);
    if (peVar2 == (element_type *)0x0) {
      local_a8 = (Container *)0x0;
    }
    else {
      __nbytes = 0;
      local_a8 = (Container *)__dynamic_cast(peVar2,&Token::typeinfo,&token::Container::typeinfo);
    }
    if (local_a8 == (Container *)0x0) {
      __assert_fail("tokens!=0",
                    "/workspace/llm4binary/github/license_c_cmakelists/sevenjay[P]cpp-markdown/src/markdown.cpp"
                    ,0x294,"bool markdown::Document::read(std::istream &)");
    }
    std::__cxx11::string::string
              ((string *)
               &tgt.
                super__List_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                ._M_impl._M_node._M_size);
    std::__cxx11::
    list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>::
    list((list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
          *)local_60);
    while (uVar3 = _getline(this,(char **)CONCAT44(in_register_00000034,__fd),
                            &tgt.
                             super__List_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                             ._M_impl._M_node._M_size,(FILE *)__nbytes), (uVar3 & 1) != 0) {
      bVar1 = anon_unknown.dwarf_2b9fb::isBlankLine
                        ((string *)
                         &tgt.
                          super__List_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                          ._M_impl._M_node._M_size);
      if (bVar1) {
        this_00 = (BlankLine *)operator_new(0x30);
        token::BlankLine::BlankLine
                  (this_00,(string *)
                           &tgt.
                            super__List_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                            ._M_impl._M_node._M_size);
        boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::BlankLine>(local_80,this_00)
        ;
        std::__cxx11::
        list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
        ::push_back((list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                     *)local_60,local_80);
        boost::shared_ptr<markdown::Token>::~shared_ptr(local_80);
      }
      else {
        this_01 = (RawText *)operator_new(0x30);
        token::RawText::RawText
                  (this_01,(string *)
                           &tgt.
                            super__List_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                            ._M_impl._M_node._M_size,true);
        boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::RawText>(&local_90,this_01);
        std::__cxx11::
        list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
        ::push_back((list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                     *)local_60,&local_90);
        boost::shared_ptr<markdown::Token>::~shared_ptr(&local_90);
      }
    }
    token::Container::appendSubtokens(local_a8,(TokenGroup *)local_60);
    this_local._7_1_ = 1;
    std::__cxx11::
    list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>::
    ~list((list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
           *)local_60);
    this = (Document *)
           std::__cxx11::string::~string
                     ((string *)
                      &tgt.
                       super__List_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                       ._M_impl._M_node._M_size);
  }
  else {
    this_local._7_1_ = 0;
  }
  return CONCAT71((int7)((ulong)this >> 8),this_local._7_1_);
}

Assistant:

bool Document::read(std::istream& in) {
	if (mProcessed) return false;

	token::Container *tokens=dynamic_cast<token::Container*>(mTokenContainer.get());
	assert(tokens!=0);

	std::string line;
	TokenGroup tgt;
	while (_getline(in, line)) {
		if (isBlankLine(line)) {
			tgt.push_back(TokenPtr(new token::BlankLine(line)));
		} else {
			tgt.push_back(TokenPtr(new token::RawText(line)));
		}
	}
	tokens->appendSubtokens(tgt);

	return true;
}